

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O1

void oonf_timer_start_ext(oonf_timer_instance *timer,uint64_t first,uint64_t interval)

{
  uint32_t *puVar1;
  uint *puVar2;
  byte bVar3;
  char *pcVar4;
  int iVar5;
  uint64_t uVar6;
  char *pcVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  isonumber_str timebuf1;
  
  if (timer->_clock == 0) {
    (timer->_node).key = timer;
    puVar1 = &timer->class->_stat_usage;
    *puVar1 = *puVar1 + 1;
  }
  else {
    avl_remove(&_timer_tree,timer);
    puVar1 = &timer->class->_stat_changes;
    *puVar1 = *puVar1 + 1;
  }
  puVar2 = &timer->_random;
  if (timer->_random == 0) {
    iVar5 = os_core_linux_get_random(puVar2,4);
    if (iVar5 != 0) {
      if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 4) != 0) {
        oonf_log(4,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0xb3,0,0,
                 "Could not get random data");
      }
      *puVar2 = 0;
    }
  }
  bVar3 = timer->jitter_pct;
  uVar8 = first;
  if (bVar3 != 0) {
    uVar10 = (ulong)*puVar2 / (0xffffffff / (ulong)bVar3);
    uVar9 = (uVar10 * first) / 100;
    if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 1) != 0) {
      oonf_log(1,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x15d,0,0,
               "TIMER: jitter %u%% (%u) rel_time %lums to %lums\n",(ulong)bVar3,uVar10,first,
               first - uVar9);
    }
    uVar8 = first - uVar9;
  }
  uVar6 = oonf_clock_getNow();
  timer->_clock = ((uVar6 + uVar8 + 100) / 100) * 100;
  uVar8 = 0;
  if (timer->class->periodic != false) {
    uVar8 = interval;
  }
  timer->_period = uVar8;
  avl_insert(&_timer_tree,timer);
  uVar10 = (ulong)_oonf_timer_subsystem.logging;
  if (((&log_global_mask)[uVar10] & 1) != 0) {
    pcVar4 = timer->class->name;
    pcVar7 = oonf_clock_toClockString(&timebuf1,first);
    oonf_log(1,uVar10,"src/base/oonf_timer.c",0xc2,0,0,
             "TIMER: start timer \'%s\' firing in %s (%lu)\n",pcVar4,pcVar7,timer->_clock);
  }
  return;
}

Assistant:

void
oonf_timer_start_ext(struct oonf_timer_instance *timer, uint64_t first, uint64_t interval) {
#ifdef OONF_LOG_DEBUG_INFO
  struct isonumber_str timebuf1;
#endif

  if (timer->_clock) {
    avl_remove(&_timer_tree, &timer->_node);
    timer->class->_stat_changes++;
  }
  else {
    timer->_node.key = timer;
    timer->class->_stat_usage++;
  }

  /*
   * Compute random numbers only once.
   */
  if (!timer->_random) {
    if (os_core_get_random(&timer->_random, sizeof(timer->_random))) {
      OONF_WARN(LOG_TIMER, "Could not get random data");
      timer->_random = 0;
    }
  }

  /* Fill entry */
  _calc_clock(timer, first);

  /* Singleshot or periodical timer ? */
  timer->_period = timer->class->periodic ? interval : 0;

  /* insert into tree */
  avl_insert(&_timer_tree, &timer->_node);

  OONF_DEBUG(LOG_TIMER, "TIMER: start timer '%s' firing in %s (%" PRIu64 ")\n", timer->class->name,
    oonf_clock_toClockString(&timebuf1, first), timer->_clock);
}